

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O3

void __thiscall gimage::View::View(View *this,View *v)

{
  Camera *pCVar1;
  
  (this->image).depth = 0;
  (this->image).width = 0;
  (this->image).height = 0;
  (this->image).n = 0;
  (this->image).pixel = (uchar *)0x0;
  (this->image).row = (uchar **)0x0;
  (this->image).img = (uchar ***)0x0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (&this->image,(v->image).width,(v->image).height,(long)(v->image).depth);
  memcpy((this->image).pixel,(v->image).pixel,(this->image).n);
  (this->depth).depth = 0;
  (this->depth).width = 0;
  (this->depth).height = 0;
  (this->depth).n = 0;
  (this->depth).pixel = (float *)0x0;
  (this->depth).row = (float **)0x0;
  (this->depth).img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (&this->depth,(v->depth).width,(v->depth).height,(long)(v->depth).depth);
  memcpy((this->depth).pixel,(v->depth).pixel,(this->depth).n << 2);
  pCVar1 = (Camera *)(**(code **)(*(long *)v->camera + 0x10))();
  this->camera = pCVar1;
  return;
}

Assistant:

View::View(const View &v) : image(v.image), depth(v.depth)
{
  camera=v.getCamera()->clone();
}